

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_Character_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x4e4f4e4500000000) {
    if (uVar1 < 0x426f6f6b46616e00) {
      if ((uVar1 & 0xffffffffff000000) != 0x42656c6c65000000) {
        return buf;
      }
      end_local = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
      if (end_local == buf) {
        return buf;
      }
      *value = 9;
      *value_sign = 0;
    }
    else if ((uVar1 & 0xffffffffff000000) == 0x4d754c616e000000) {
      end_local = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
      if (end_local == buf) {
        return buf;
      }
      *value = 2;
      *value_sign = 0;
    }
    else {
      if ((uVar1 & 0xffffffffffffff00) != 0x426f6f6b46616e00) {
        return buf;
      }
      end_local = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
      if (end_local == buf) {
        return buf;
      }
      *value = 10;
      *value_sign = 0;
    }
  }
  else if (uVar1 < 0x4f74686572000000) {
    if ((uVar1 & 0xffffffff00000000) != 0x4e4f4e4500000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0;
    *value_sign = 0;
  }
  else if (uVar1 < 0x526170756e7a656c) {
    if ((uVar1 & 0xffffffffff000000) != 0x4f74686572000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xb;
    *value_sign = 0;
  }
  else if ((uVar1 & 0xffffffffffff0000) == 0x556e757365640000) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xff;
    *value_sign = 0;
  }
  else {
    if (uVar1 != 0x526170756e7a656c) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 8;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *Fantasy_Character_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4e4f4e4500000000) { /* branch "NONE" */
        if (w < 0x426f6f6b46616e00) { /* branch "BookFan" */
            if ((w & 0xffffffffff000000) == 0x42656c6c65000000) { /* "Belle" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(9), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "Belle" */
                return unmatched;
            } /* "Belle" */
        } else { /* branch "BookFan" */
            if ((w & 0xffffffffff000000) == 0x4d754c616e000000) { /* "MuLan" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "MuLan" */
                if ((w & 0xffffffffffffff00) == 0x426f6f6b46616e00) { /* "BookFan" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(10), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "BookFan" */
                    return unmatched;
                } /* "BookFan" */
            } /* "MuLan" */
        } /* branch "BookFan" */
    } else { /* branch "NONE" */
        if (w < 0x4f74686572000000) { /* branch "Other" */
            if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(0), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "NONE" */
                return unmatched;
            } /* "NONE" */
        } else { /* branch "Other" */
            if (w < 0x526170756e7a656c) { /* branch "Rapunzel" */
                if ((w & 0xffffffffff000000) == 0x4f74686572000000) { /* "Other" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(11), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "Other" */
                    return unmatched;
                } /* "Other" */
            } else { /* branch "Rapunzel" */
                if ((w & 0xffffffffffff0000) == 0x556e757365640000) { /* "Unused" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(255), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "Unused" */
                    if (w == 0x526170756e7a656c) { /* "Rapunzel" */
                        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
                        if (buf != mark) {
                            *value = UINT64_C(8), *value_sign = 0;
                        } else {
                            return unmatched;
                        }
                    } else { /* "Rapunzel" */
                        return unmatched;
                    } /* "Rapunzel" */
                } /* "Unused" */
            } /* branch "Rapunzel" */
        } /* branch "Other" */
    } /* branch "NONE" */
    return buf;
}